

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::DetachShader::exec(DetachShader *this,Thread *t)

{
  ostream *poVar1;
  Program *pPVar2;
  deUint32 dVar3;
  Thread *pTVar4;
  undefined1 local_1b0 [136];
  ios_base local_128 [264];
  
  pTVar4 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar4 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar4;
    if (this->m_type == 0x8b30) {
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      poVar1 = (ostream *)(local_1b0 + 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glDetachShader(",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_128);
      pPVar2 = (this->m_program).m_ptr;
      (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x4e0))
                (pPVar2->program,pPVar2->runtimeFragmentShader);
      dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
      glu::checkError(dVar3,"detachShader(m_program->program, m_program->runtimeFragmentShader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                      ,0x65b);
      local_1b0._0_8_ = pTVar4;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x18),"End -- glDetachShader()",0x17);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_128);
      ((this->m_program).m_ptr)->runtimeFragmentShader = 0;
    }
    else if (this->m_type == 0x8b31) {
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      poVar1 = (ostream *)(local_1b0 + 0x18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glDetachShader(",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_128);
      pPVar2 = (this->m_program).m_ptr;
      (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x4e0))
                (pPVar2->program,pPVar2->runtimeVertexShader);
      dVar3 = (**(code **)(*(long *)&pTVar4[1].super_Thread.m_attribs + 0x800))();
      glu::checkError(dVar3,"detachShader(m_program->program, m_program->runtimeVertexShader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                      ,0x654);
      local_1b0._0_8_ = pTVar4;
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 0x18),"End -- glDetachShader()",0x17);
      tcu::ThreadUtil::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_128);
      ((this->m_program).m_ptr)->runtimeVertexShader = 0;
    }
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DetachShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	if (m_type == GL_VERTEX_SHADER)
	{
		thread.newMessage() << "Begin -- glDetachShader(" << m_program->program << ", " << m_program->runtimeVertexShader << ")" << tcu::ThreadUtil::Message::End;
		GLU_CHECK_GLW_CALL(thread.gl, detachShader(m_program->program, m_program->runtimeVertexShader));
		thread.newMessage() << "End -- glDetachShader()" << tcu::ThreadUtil::Message::End;
		m_program->runtimeVertexShader = 0;
	}
	else if (m_type == GL_FRAGMENT_SHADER)
	{
		thread.newMessage() << "Begin -- glDetachShader(" << m_program->program << ", " << m_program->runtimeFragmentShader << ")" << tcu::ThreadUtil::Message::End;
		GLU_CHECK_GLW_CALL(thread.gl, detachShader(m_program->program, m_program->runtimeFragmentShader));
		thread.newMessage() << "End -- glDetachShader()" << tcu::ThreadUtil::Message::End;
		m_program->runtimeFragmentShader = 0;
	}
	else
		DE_ASSERT(false);
}